

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int bitset_lenrange_cardinality(uint64_t *words,uint32_t start,uint32_t lenminusone)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint local_30;
  int local_2c;
  uint32_t i;
  int answer;
  uint32_t endword;
  uint32_t firstword;
  uint32_t lenminusone_local;
  uint32_t start_local;
  uint64_t *words_local;
  
  local_30 = start >> 6;
  uVar2 = start + lenminusone >> 6;
  bVar1 = (byte)start;
  if (local_30 == uVar2) {
    words_local._4_4_ =
         hamming(words[local_30] &
                 (0xffffffffffffffffU >> (0x3fU - (char)lenminusone & 0x3f)) << (bVar1 & 0x3f));
  }
  else {
    local_2c = hamming(words[local_30] & -1L << (bVar1 & 0x3f));
    while (local_30 = local_30 + 1, local_30 < uVar2) {
      iVar3 = hamming(words[local_30]);
      local_2c = iVar3 + local_2c;
    }
    iVar3 = hamming(words[uVar2] &
                    0xffffffffffffffffU >> ((bVar1 ^ 0xff) - (char)lenminusone & 0x3f));
    words_local._4_4_ = iVar3 + local_2c;
  }
  return words_local._4_4_;
}

Assistant:

static inline int bitset_lenrange_cardinality(const uint64_t *words,
                                              uint32_t start,
                                              uint32_t lenminusone) {
    uint32_t firstword = start / 64;
    uint32_t endword = (start + lenminusone) / 64;
    if (firstword == endword) {
        return hamming(words[firstword] &
                       ((~UINT64_C(0)) >> ((63 - lenminusone) % 64))
                           << (start % 64));
    }
    int answer = hamming(words[firstword] & ((~UINT64_C(0)) << (start % 64)));
    for (uint32_t i = firstword + 1; i < endword; i++) {
        answer += hamming(words[i]);
    }
    answer +=
        hamming(words[endword] &
                (~UINT64_C(0)) >> (((~start + 1) - lenminusone - 1) % 64));
    return answer;
}